

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_api_test.c
# Opt level: O0

int main(void)

{
  int local_12c;
  RK_S32 i;
  RcApiBrief briefs [16];
  undefined1 *local_20;
  RcApiQueryAll query;
  
  query.count = 0;
  _mpp_log_l(4,"mpp_api_test","rc api test start\n",0);
  local_20 = &stack0xfffffffffffffed8;
  query.brief._0_4_ = 0x10;
  query.brief._4_4_ = 0;
  rc_brief_get_all(&local_20);
  _mpp_log_l(4,"mpp_api_test","default rc api query result:\n",0);
  for (local_12c = 0; local_12c < query.brief._4_4_; local_12c = local_12c + 1) {
    _mpp_log_l(4,"mpp_api_test","rc api %s type %x\n",0,
               *(undefined8 *)(&stack0xfffffffffffffed8 + (long)local_12c * 0x10),
               *(undefined4 *)&briefs[local_12c].name);
  }
  _mpp_log_l(4,"mpp_api_test","add test rc api\n",0);
  rc_api_add(&test_h264_api);
  rc_api_add(&test_h265_api);
  rc_brief_get_all(&local_20);
  _mpp_log_l(4,"mpp_api_test","rc api query result after adding\n",0);
  for (local_12c = 0; local_12c < query.brief._4_4_; local_12c = local_12c + 1) {
    _mpp_log_l(4,"mpp_api_test","rc api %s type %x\n",0,
               *(undefined8 *)(&stack0xfffffffffffffed8 + (long)local_12c * 0x10),
               *(undefined4 *)&briefs[local_12c].name);
  }
  _mpp_log_l(4,"mpp_api_test","mpp rc api test done\n",0);
  return 0;
}

Assistant:

int main()
{
    RcApiQueryAll query;
    RcApiBrief briefs[MAX_QUERY_COUNT];
    RK_S32 i;

    mpp_log("rc api test start\n");

    query.brief = briefs;
    query.max_count = MAX_QUERY_COUNT;
    query.count = 0;

    rc_brief_get_all(&query);

    mpp_log("default rc api query result:\n");
    for (i = 0; i < query.count; i++)
        mpp_log("rc api %s type %x\n", briefs[i].name, briefs[i].type);

    mpp_log("add test rc api\n");

    rc_api_add(&test_h264_api);
    rc_api_add(&test_h265_api);

    rc_brief_get_all(&query);

    mpp_log("rc api query result after adding\n");
    for (i = 0; i < query.count; i++)
        mpp_log("rc api %s type %x\n", briefs[i].name, briefs[i].type);

    mpp_log("mpp rc api test done\n");

    return 0;
}